

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm2_enc.c
# Opt level: O0

int sm2_asym_encrypt(void *vpsm2ctx,uchar *out,size_t *outlen,size_t outsize,uchar *in,size_t inlen)

{
  int iVar1;
  EVP_MD *pEVar2;
  size_t in_RCX;
  EVP_MD *in_RDX;
  long in_RSI;
  PROV_SM2_CTX *in_RDI;
  size_t *in_R8;
  undefined8 in_R9;
  EVP_MD *md;
  PROV_SM2_CTX *psm2ctx;
  size_t *in_stack_000000a8;
  uint8_t *in_stack_000000b0;
  size_t in_stack_000000b8;
  uint8_t *in_stack_000000c0;
  EVP_MD *in_stack_000000c8;
  EC_KEY *in_stack_000000d0;
  int line;
  undefined4 local_4;
  
  line = (int)((ulong)in_R9 >> 0x20);
  pEVar2 = sm2_get_md(in_RDI);
  if (pEVar2 == (EVP_MD *)0x0) {
    local_4 = 0;
  }
  else if (in_RSI == 0) {
    iVar1 = ossl_sm2_ciphertext_size((EC_KEY *)0x0,in_RDX,in_RCX,in_R8);
    if (iVar1 == 0) {
      ERR_new();
      ERR_set_debug((char *)in_R8,line,(char *)in_RDI);
      ERR_set_error(0x39,0x9e,(char *)0x0);
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = ossl_sm2_encrypt(in_stack_000000d0,in_stack_000000c8,in_stack_000000c0,
                               in_stack_000000b8,in_stack_000000b0,in_stack_000000a8);
  }
  return local_4;
}

Assistant:

static int sm2_asym_encrypt(void *vpsm2ctx, unsigned char *out, size_t *outlen,
                            size_t outsize, const unsigned char *in,
                            size_t inlen)
{
    PROV_SM2_CTX *psm2ctx = (PROV_SM2_CTX *)vpsm2ctx;
    const EVP_MD *md = sm2_get_md(psm2ctx);

    if (md == NULL)
        return 0;

    if (out == NULL) {
        if (!ossl_sm2_ciphertext_size(psm2ctx->key, md, inlen, outlen)) {
            ERR_raise(ERR_LIB_PROV, PROV_R_INVALID_KEY);
            return 0;
        }
        return 1;
    }

    return ossl_sm2_encrypt(psm2ctx->key, md, in, inlen, out, outlen);
}